

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O2

void __thiscall pstore::basic_logger::~basic_logger(basic_logger *this)

{
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__basic_logger_0015a4f0;
  std::__cxx11::string::~string((string *)&this->thread_name_);
  logger::~logger(&this->super_logger);
  return;
}

Assistant:

basic_logger () = default;